

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O3

string * vkt::image::anon_unknown_2::getAtomicFuncArgumentShaderStr
                   (string *__return_storage_ptr__,AtomicOperation op,string *x,string *y,string *z,
                   IVec3 *gridSize)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  string *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer *ppcVar6;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  pointer pcVar10;
  ulong uVar11;
  long *local_308;
  undefined8 local_300;
  long local_2f8;
  undefined8 uStack_2f0;
  pointer *local_2e8;
  long local_2e0;
  pointer local_2d8;
  long lStack_2d0;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  long *local_2a8;
  undefined8 local_2a0;
  long local_298;
  undefined8 uStack_290;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  undefined1 local_208 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  ulong local_1b8 [2];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  if (op < ATOMIC_OPERATION_EXCHANGE) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   "(",x);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_208);
    local_1e8._M_allocated_capacity = (size_type)&local_1d8;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar5) {
      local_1d8._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_1d8._8_8_ = plVar3[3];
    }
    else {
      local_1d8._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_1e8._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar3;
    }
    local_1e8._8_8_ = plVar3[1];
    *plVar3 = (long)paVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               (local_1e8._M_local_buf,(ulong)(x->_M_dataplus)._M_p);
    ppcVar6 = (pointer *)(plVar3 + 2);
    if ((pointer *)*plVar3 == ppcVar6) {
      local_2d8 = *ppcVar6;
      lStack_2d0 = plVar3[3];
      local_2e8 = &local_2d8;
    }
    else {
      local_2d8 = *ppcVar6;
      local_2e8 = (pointer *)*plVar3;
    }
    local_2e0 = plVar3[1];
    *plVar3 = (long)ppcVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
    local_308 = &local_2f8;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_2f8 = *plVar3;
      uStack_2f0 = puVar4[3];
    }
    else {
      local_2f8 = *plVar3;
      local_308 = (long *)*puVar4;
    }
    local_300 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_308,(ulong)(y->_M_dataplus)._M_p);
    local_288 = &local_278;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_278 = *plVar7;
      lStack_270 = plVar3[3];
    }
    else {
      local_278 = *plVar7;
      local_288 = (long *)*plVar3;
    }
    local_280 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_268 = &local_258;
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_258 = *plVar7;
      lStack_250 = plVar3[3];
    }
    else {
      local_258 = *plVar7;
      local_268 = (long *)*plVar3;
    }
    local_260 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_268,(ulong)(y->_M_dataplus)._M_p);
    local_2c8 = &local_2b8;
    puVar8 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar8) {
      local_2b8 = *puVar8;
      lStack_2b0 = plVar3[3];
    }
    else {
      local_2b8 = *puVar8;
      local_2c8 = (ulong *)*plVar3;
    }
    local_2c0 = plVar3[1];
    *plVar3 = (long)puVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_298 = *plVar3;
      uStack_290 = puVar4[3];
      local_2a8 = &local_298;
    }
    else {
      local_298 = *plVar3;
      local_2a8 = (long *)*puVar4;
    }
    local_2a0 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_2a8,(ulong)(z->_M_dataplus)._M_p);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_238 = *plVar7;
      lStack_230 = plVar3[3];
      local_248 = &local_238;
    }
    else {
      local_238 = *plVar7;
      local_248 = (long *)*plVar3;
    }
    local_240 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_248);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_218 = *plVar7;
      lStack_210 = plVar3[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar7;
      local_228 = (long *)*plVar3;
    }
    local_220 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_228,(ulong)(z->_M_dataplus)._M_p);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_198 = *plVar7;
      lStack_190 = plVar3[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar7;
      local_1a8 = (long *)*plVar3;
    }
    local_1a0 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar9) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,(ulong)(local_2d8 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_allocated_capacity != &local_1d8) {
      operator_delete((void *)local_1e8._M_allocated_capacity,
                      (ulong)(local_1d8._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_208._0_8_ == local_208 + 0x10) {
      return (string *)(local_208 + 0x10);
    }
    goto LAB_007203b3;
  }
  if (op != ATOMIC_OPERATION_EXCHANGE) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8,
                 "((",z);
  plVar3 = (long *)std::__cxx11::string::append(local_1e8._M_local_buf);
  ppcVar6 = (pointer *)(plVar3 + 2);
  if ((pointer *)*plVar3 == ppcVar6) {
    local_2d8 = *ppcVar6;
    lStack_2d0 = plVar3[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *ppcVar6;
    local_2e8 = (pointer *)*plVar3;
  }
  local_2e0 = plVar3[1];
  *plVar3 = (long)ppcVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  iVar1 = gridSize->m_data[0];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::ostream::operator<<(&local_1a8,iVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pcVar10 = (pointer)0xf;
  if (local_2e8 != &local_2d8) {
    pcVar10 = local_2d8;
  }
  if (pcVar10 < (pointer)(local_208._8_8_ + local_2e0)) {
    pcVar10 = (pointer)0xf;
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      pcVar10 = (pointer)local_208._16_8_;
    }
    if (pcVar10 < (pointer)(local_208._8_8_ + local_2e0)) goto LAB_007204ec;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,(ulong)local_2e8);
  }
  else {
LAB_007204ec:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,local_208._0_8_);
  }
  local_308 = &local_2f8;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_2f8 = *plVar3;
    uStack_2f0 = puVar4[3];
  }
  else {
    local_2f8 = *plVar3;
    local_308 = (long *)*puVar4;
  }
  local_300 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_308);
  local_288 = &local_278;
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_278 = *plVar7;
    lStack_270 = plVar3[3];
  }
  else {
    local_278 = *plVar7;
    local_288 = (long *)*plVar3;
  }
  local_280 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_288,(ulong)(x->_M_dataplus)._M_p);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_258 = *plVar7;
    lStack_250 = plVar3[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *plVar7;
    local_268 = (long *)*plVar3;
  }
  local_260 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_268);
  puVar8 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar8) {
    local_2b8 = *puVar8;
    lStack_2b0 = plVar3[3];
    local_2c8 = &local_2b8;
  }
  else {
    local_2b8 = *puVar8;
    local_2c8 = (ulong *)*plVar3;
  }
  local_2c0 = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  iVar1 = gridSize->m_data[1];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::ostream::operator<<(&local_1a8,iVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar11 = 0xf;
  if (local_2c8 != &local_2b8) {
    uVar11 = local_2b8;
  }
  if (uVar11 < (ulong)(local_1c8._8_8_ + local_2c0)) {
    uVar11 = 0xf;
    if ((ulong *)local_1c8._M_allocated_capacity != local_1b8) {
      uVar11 = local_1b8[0];
    }
    if (uVar11 < (ulong)(local_1c8._8_8_ + local_2c0)) goto LAB_00720715;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_2c8);
  }
  else {
LAB_00720715:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2c8,local_1c8._M_allocated_capacity);
  }
  local_2a8 = &local_298;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_298 = *plVar3;
    uStack_290 = puVar4[3];
  }
  else {
    local_298 = *plVar3;
    local_2a8 = (long *)*puVar4;
  }
  local_2a0 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_238 = *plVar7;
    lStack_230 = plVar3[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar7;
    local_248 = (long *)*plVar3;
  }
  local_240 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)(y->_M_dataplus)._M_p);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_218 = *plVar7;
    lStack_210 = plVar3[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar7;
    local_228 = (long *)*plVar3;
  }
  local_220 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar9) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if ((ulong *)local_1c8._M_allocated_capacity != local_1b8) {
    operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8[0] + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,(ulong)(local_2d8 + 1));
  }
  local_208._16_8_ = local_1d8._M_allocated_capacity;
  local_208._0_8_ = local_1e8._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_allocated_capacity == &local_1d8) {
    return (string *)&local_1d8;
  }
LAB_007203b3:
  operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
  return extraout_RAX;
}

Assistant:

static string getAtomicFuncArgumentShaderStr (const AtomicOperation	op,
											  const string&			x,
											  const string&			y,
											  const string&			z,
											  const IVec3&			gridSize)
{
	switch (op)
	{
		case ATOMIC_OPERATION_ADD:
		case ATOMIC_OPERATION_MIN:
		case ATOMIC_OPERATION_MAX:
		case ATOMIC_OPERATION_AND:
		case ATOMIC_OPERATION_OR:
		case ATOMIC_OPERATION_XOR:
			return string("(" + x + "*" + x + " + " + y + "*" + y + " + " + z + "*" + z + ")");
		case ATOMIC_OPERATION_EXCHANGE:
			return string("((" + z + "*" + toString(gridSize.x()) + " + " + x + ")*" + toString(gridSize.y()) + " + " + y + ")");
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}